

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxbasis.hpp
# Opt level: O0

void __thiscall
soplex::
SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::change(SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         *this,int i,SPxId *id,
        SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        *enterVec,
        SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        *eta)

{
  undefined8 uVar1;
  bool bVar2;
  type_conflict5 tVar3;
  int iVar4;
  int iVar5;
  Verbosity VVar6;
  int iVar7;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  **ppSVar8;
  DataKey *pDVar9;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_RCX;
  DataKey *in_RDX;
  uint in_ESI;
  time_t *__timer;
  SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_RDI;
  undefined8 in_R8;
  Verbosity old_verbosity_6;
  Verbosity old_verbosity_5;
  SPxException *F;
  Verbosity old_verbosity_4;
  Verbosity old_verbosity_3;
  Verbosity old_verbosity_2;
  Verbosity old_verbosity_1;
  Verbosity old_verbosity;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_2;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_2;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_1;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_1;
  cpp_dec_float<50U,_int,_void> *u;
  cpp_dec_float<50U,_int,_void> *this_00;
  double *args_7;
  cpp_dec_float<50U,_int,_void> *in_stack_fffffffffffffab0;
  type_conflict5 local_531;
  undefined1 local_4a8 [56];
  undefined1 local_470 [56];
  undefined4 local_438;
  Verbosity local_434;
  undefined1 local_430 [100];
  undefined4 local_3cc;
  Verbosity local_3c8;
  undefined1 local_3c4 [56];
  undefined4 local_38c;
  Verbosity local_388;
  undefined1 local_384 [56];
  undefined4 local_34c;
  Verbosity local_348;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_344;
  undefined1 local_30c [56];
  int local_2d4;
  undefined1 local_2d0 [56];
  undefined1 local_298 [56];
  undefined4 local_260;
  Verbosity local_25c;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_258;
  int local_220;
  undefined1 local_21c [56];
  int local_1e4;
  undefined1 local_1e0 [56];
  double local_1a8;
  undefined1 local_1a0 [24];
  DataKey *local_188;
  uint local_17c;
  undefined8 local_170;
  int *local_168;
  undefined1 *local_160;
  undefined8 local_158;
  int *local_150;
  undefined1 *local_148;
  undefined8 local_140;
  int *local_138;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_130;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_128;
  undefined1 *local_120;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_118;
  undefined1 *local_110;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_108;
  undefined1 *local_100;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_f8;
  undefined1 *local_f0;
  int *local_e8;
  int *local_e0;
  int *local_d8;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_c9;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_c8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_c0;
  undefined1 *local_b8;
  undefined1 *local_b0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_a0;
  undefined1 *local_98;
  long local_90;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_81;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_80;
  int *local_78;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_70;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_68;
  int *local_60;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_58;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_50;
  long local_48;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_39;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_38;
  int *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  int *local_18;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_10;
  undefined1 *local_8;
  
  in_RDI->lastidx = in_ESI;
  (in_RDI->lastin).super_DataKey = *in_RDX;
  local_1a0._8_8_ = in_R8;
  local_1a0._16_8_ = in_RCX;
  local_188 = in_RDX;
  local_17c = in_ESI;
  bVar2 = SPxId::isValid((SPxId *)in_RDX);
  if ((bVar2) && (-1 < (int)local_17c)) {
    iVar7 = in_RDI->nzCount;
    ppSVar8 = DataArray<const_soplex::SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_*>
              ::operator[](&in_RDI->matrix,local_17c);
    iVar4 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::size(*ppSVar8);
    iVar5 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::size((SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *)local_1a0._16_8_);
    uVar1 = local_1a0._16_8_;
    in_RDI->nzCount = (iVar7 - iVar4) + iVar5;
    ppSVar8 = DataArray<const_soplex::SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_*>
              ::operator[](&in_RDI->matrix,local_17c);
    *ppSVar8 = (SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)uVar1;
    pDVar9 = &DataArray<soplex::SPxId>::operator[](&in_RDI->theBaseId,local_17c)->super_DataKey;
    (in_RDI->lastout).super_DataKey = *pDVar9;
    __timer = (time_t *)(ulong)local_17c;
    pDVar9 = &DataArray<soplex::SPxId>::operator[](&in_RDI->theBaseId,local_17c)->super_DataKey;
    *pDVar9 = *local_188;
    in_RDI->iterCount = in_RDI->iterCount + 1;
    in_RDI->updateCount = in_RDI->updateCount + 1;
    local_1a0._4_4_ = iteration(in_RDI);
    local_1a0._0_4_ = (*in_RDI->factor->_vptr_SLinSolver[3])();
    this_00 = &(in_RDI->lastFill).m_backend;
    SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::time(in_RDI->theLP,__timer);
    u = (cpp_dec_float<50U,_int,_void> *)local_1a0;
    args_7 = &local_1a8;
    SPxOut::
    debug<soplex::SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_const_char_(&)[117],_int,_int_&,_int_&,_int_&,_int,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_&,_double,_0>
              (in_RDI,(char (*) [117])
                      "factor_stats: iteration= {}, update= {}, total_update= {}, nonzero_B= {}, nonzero_LU= {}, factor_fill= {}, time= {}\n"
               ,(int *)(local_1a0 + 4),&in_RDI->updateCount,&in_RDI->totalUpdateCount,
               &in_RDI->nzCount,(int *)u,
               (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)this_00,args_7);
    if ((in_RDI->factorized & 1U) == 0) {
      (*in_RDI->_vptr_SPxBasisBase[0xb])();
    }
    else {
      local_1e4 = (*in_RDI->factor->_vptr_SLinSolver[3])();
      local_160 = local_1e0;
      local_168 = &local_1e4;
      local_170._0_4_ = cpp_dec_float_finite;
      local_170._4_4_ = 0;
      local_d8 = local_168;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                (in_stack_fffffffffffffab0,(longlong)args_7,this_00);
      local_220 = (*in_RDI->factor->_vptr_SLinSolver[4])();
      local_220 = local_220 + 1000;
      local_78 = &in_RDI->lastMem;
      local_80 = &in_RDI->memFactor;
      local_70 = &local_258;
      boost::multiprecision::detail::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
      ::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                (&local_81,local_80);
      local_68 = &local_258;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float(this_00);
      local_50 = &local_258;
      local_58 = local_80;
      local_60 = local_78;
      local_90 = (long)*local_78;
      boost::multiprecision::default_ops::
      eval_multiply<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,long_long>
                (this_00,u,(longlong *)0x3373a1);
      local_28 = local_21c;
      local_30 = &local_220;
      local_38 = &local_258;
      boost::multiprecision::detail::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
      ::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                (&local_39,local_38);
      local_20 = local_21c;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float(this_00);
      local_8 = local_21c;
      local_10 = local_38;
      local_18 = local_30;
      local_48 = (long)*local_30;
      boost::multiprecision::default_ops::
      eval_add<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,long_long>
                (this_00,u,(longlong *)0x337463);
      tVar3 = boost::multiprecision::operator>
                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)u,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)0x337478);
      if (tVar3) {
        if ((in_RDI->spxout != (SPxOut *)0x0) &&
           (VVar6 = SPxOut::getVerbosity(in_RDI->spxout), 4 < (int)VVar6)) {
          local_25c = SPxOut::getVerbosity(in_RDI->spxout);
          local_260 = 5;
          (*in_RDI->spxout->_vptr_SPxOut[2])(in_RDI->spxout,&local_260);
          soplex::operator<<((SPxOut *)this_00,(char *)u);
          soplex::operator<<((SPxOut *)this_00,(char *)u);
          (*in_RDI->factor->_vptr_SLinSolver[3])();
          soplex::operator<<((SPxOut *)this_00,(int)((ulong)u >> 0x20));
          soplex::operator<<((SPxOut *)this_00,(char *)u);
          soplex::operator<<((SPxOut *)this_00,(int)((ulong)u >> 0x20));
          soplex::operator<<((SPxOut *)this_00,(char *)u);
          local_128 = &in_RDI->memFactor;
          local_120 = local_298;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float(this_00,u);
          soplex::operator<<((SPxOut *)this_00,
                             (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)u);
          soplex::operator<<((SPxOut *)this_00,(_func_ostream_ptr_ostream_ptr *)u);
          (*in_RDI->spxout->_vptr_SPxOut[2])(in_RDI->spxout,&local_25c);
        }
        (*in_RDI->_vptr_SPxBasisBase[0xb])();
      }
      else {
        local_2d4 = (*in_RDI->factor->_vptr_SLinSolver[3])();
        local_148 = local_2d0;
        local_150 = &local_2d4;
        local_158 = 0;
        local_e0 = local_150;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                  (in_stack_fffffffffffffab0,(longlong)args_7,this_00);
        local_138 = &in_RDI->nzCount;
        local_130 = &local_344;
        local_140 = 0;
        local_e8 = local_138;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                  (in_stack_fffffffffffffab0,(longlong)args_7,this_00);
        local_b8 = local_30c;
        local_c8 = &local_344;
        local_c0 = &in_RDI->lastFill;
        boost::multiprecision::detail::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
        ::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  (&local_c9,&in_RDI->lastFill,local_c8);
        local_b0 = local_30c;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float(this_00);
        local_98 = local_30c;
        local_a0 = local_c0;
        local_a8 = local_c8;
        boost::multiprecision::default_ops::
        eval_multiply<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  (this_00,u,(cpp_dec_float<50U,_int,_void> *)0x3377ab);
        tVar3 = boost::multiprecision::operator>
                          ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)u,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)0x3377c0);
        if (tVar3) {
          if ((in_RDI->spxout != (SPxOut *)0x0) &&
             (VVar6 = SPxOut::getVerbosity(in_RDI->spxout), 4 < (int)VVar6)) {
            local_348 = SPxOut::getVerbosity(in_RDI->spxout);
            local_34c = 5;
            (*in_RDI->spxout->_vptr_SPxOut[2])(in_RDI->spxout,&local_34c);
            soplex::operator<<((SPxOut *)this_00,(char *)u);
            soplex::operator<<((SPxOut *)this_00,(char *)u);
            (*in_RDI->factor->_vptr_SLinSolver[3])();
            soplex::operator<<((SPxOut *)this_00,(int)((ulong)u >> 0x20));
            soplex::operator<<((SPxOut *)this_00,(char *)u);
            soplex::operator<<((SPxOut *)this_00,(int)((ulong)u >> 0x20));
            soplex::operator<<((SPxOut *)this_00,(char *)u);
            local_118 = &in_RDI->lastFill;
            local_110 = local_384;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float(this_00,u)
            ;
            soplex::operator<<((SPxOut *)this_00,
                               (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)u);
            soplex::operator<<((SPxOut *)this_00,(_func_ostream_ptr_ostream_ptr *)u);
            (*in_RDI->spxout->_vptr_SPxOut[2])(in_RDI->spxout,&local_348);
          }
          (*in_RDI->_vptr_SPxBasisBase[0xb])();
        }
        else if (in_RDI->lastNzCount < in_RDI->nzCount) {
          if ((in_RDI->spxout != (SPxOut *)0x0) &&
             (VVar6 = SPxOut::getVerbosity(in_RDI->spxout), 4 < (int)VVar6)) {
            local_388 = SPxOut::getVerbosity(in_RDI->spxout);
            local_38c = 5;
            (*in_RDI->spxout->_vptr_SPxOut[2])(in_RDI->spxout,&local_38c);
            soplex::operator<<((SPxOut *)this_00,(char *)u);
            soplex::operator<<((SPxOut *)this_00,(char *)u);
            soplex::operator<<((SPxOut *)this_00,(int)((ulong)u >> 0x20));
            soplex::operator<<((SPxOut *)this_00,(char *)u);
            soplex::operator<<((SPxOut *)this_00,(int)((ulong)u >> 0x20));
            soplex::operator<<((SPxOut *)this_00,(char *)u);
            local_108 = &in_RDI->nonzeroFactor;
            local_100 = local_3c4;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float(this_00,u)
            ;
            soplex::operator<<((SPxOut *)this_00,
                               (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)u);
            soplex::operator<<((SPxOut *)this_00,(_func_ostream_ptr_ostream_ptr *)u);
            (*in_RDI->spxout->_vptr_SPxOut[2])(in_RDI->spxout,&local_388);
          }
          (*in_RDI->_vptr_SPxBasisBase[0xb])();
        }
        else if (in_RDI->updateCount < in_RDI->maxUpdates) {
          (*in_RDI->factor->_vptr_SLinSolver[9])
                    (in_RDI->factor,(ulong)local_17c,local_1a0._16_8_,local_1a0._8_8_);
          in_RDI->totalUpdateCount = in_RDI->totalUpdateCount + 1;
          iVar7 = (*in_RDI->factor->_vptr_SLinSolver[1])();
          local_531 = true;
          if (iVar7 == 0) {
            (*in_RDI->factor->_vptr_SLinSolver[6])(local_430);
            local_531 = boost::multiprecision::operator<
                                  ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                    *)u,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                         *)0x337ffd);
          }
          if (local_531 != false) {
            if ((in_RDI->spxout != (SPxOut *)0x0) &&
               (VVar6 = SPxOut::getVerbosity(in_RDI->spxout), 4 < (int)VVar6)) {
              local_434 = SPxOut::getVerbosity(in_RDI->spxout);
              local_438 = 5;
              (*in_RDI->spxout->_vptr_SPxOut[2])(in_RDI->spxout,&local_438);
              soplex::operator<<((SPxOut *)this_00,(char *)u);
              soplex::operator<<((SPxOut *)this_00,(char *)u);
              (*in_RDI->factor->_vptr_SLinSolver[6])(local_470);
              soplex::operator<<((SPxOut *)this_00,
                                 (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)u);
              soplex::operator<<((SPxOut *)this_00,(char *)u);
              local_f8 = &in_RDI->minStab;
              local_f0 = local_4a8;
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                        (this_00,u);
              soplex::operator<<((SPxOut *)this_00,
                                 (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)u);
              soplex::operator<<((SPxOut *)this_00,(_func_ostream_ptr_ostream_ptr *)u);
              (*in_RDI->spxout->_vptr_SPxOut[2])(in_RDI->spxout,&local_434);
            }
            (*in_RDI->_vptr_SPxBasisBase[0xb])();
          }
        }
        else {
          if ((in_RDI->spxout != (SPxOut *)0x0) &&
             (VVar6 = SPxOut::getVerbosity(in_RDI->spxout), 4 < (int)VVar6)) {
            local_3c8 = SPxOut::getVerbosity(in_RDI->spxout);
            local_3cc = 5;
            (*in_RDI->spxout->_vptr_SPxOut[2])(in_RDI->spxout,&local_3cc);
            soplex::operator<<((SPxOut *)this_00,(char *)u);
            soplex::operator<<((SPxOut *)this_00,(char *)u);
            soplex::operator<<((SPxOut *)this_00,(int)((ulong)u >> 0x20));
            soplex::operator<<((SPxOut *)this_00,(char *)u);
            soplex::operator<<((SPxOut *)this_00,(int)((ulong)u >> 0x20));
            soplex::operator<<((SPxOut *)this_00,(_func_ostream_ptr_ostream_ptr *)u);
            (*in_RDI->spxout->_vptr_SPxOut[2])(in_RDI->spxout,&local_3c8);
          }
          (*in_RDI->_vptr_SPxBasisBase[0xb])();
        }
      }
    }
  }
  else {
    (in_RDI->lastout).super_DataKey = *local_188;
  }
  return;
}

Assistant:

void SPxBasisBase<R>::change(
   int i,
   SPxId& id,
   const SVectorBase<R>* enterVec,
   const SSVectorBase<R>* eta)
{

   assert(matrixIsSetup);
   assert(!id.isValid() || (enterVec != nullptr));
   assert(factor != nullptr);

   lastidx = i;
   lastin  = id;

   if(id.isValid() && i >= 0)
   {
      assert(enterVec != nullptr);

      // update the counter for nonzeros in the basis matrix
      nzCount      = nzCount - matrix[i]->size() + enterVec->size();
      // let the new id enter the basis
      matrix[i]    = enterVec;
      lastout      = theBaseId[i];
      theBaseId[i] = id;

      ++iterCount;
      ++updateCount;

      SPxOut::debug(this,
                    "factor_stats: iteration= {}, update= {}, total_update= {}, nonzero_B= {}, nonzero_LU= {}, factor_fill= {}, time= {}\n",
                    this->iteration(), updateCount, totalUpdateCount, nzCount, factor->memory(), lastFill,
                    theLP->time());

      // never factorize? Just do it !
      if(!factorized)
         factorize();

      // too much memory growth ?
      else if(R(factor->memory()) > 1000 + factor->dim() + lastMem * memFactor)
      {
         SPX_MSG_INFO3((*this->spxout), (*this->spxout) <<
                       "IBASIS04 memory growth factor triggers refactorization"
                       << " memory= " << factor->memory()
                       << " lastMem= " << lastMem
                       << " memFactor= " << memFactor
                       << std::endl;)
         factorize();
      }

      // relative fill too high ?
      else if(R(factor->memory()) > lastFill * R(nzCount))
      {
         SPX_MSG_INFO3((*this->spxout), (*this->spxout) << "IBASIS04 fill factor triggers refactorization"
                       << " memory= " << factor->memory()
                       << " nzCount= " << nzCount
                       << " lastFill= " << lastFill
                       << std::endl;)

         factorize();
      }
      // absolute fill in basis matrix too high ?
      else if(nzCount > lastNzCount)
      {
         SPX_MSG_INFO3((*this->spxout), (*this->spxout) << "IBASIS05 nonzero factor triggers refactorization"
                       << " nzCount= " << nzCount
                       << " lastNzCount= " << lastNzCount
                       << " nonzeroFactor= " << nonzeroFactor
                       << std::endl;)
         factorize();
      }
      // too many updates ?
      else if(updateCount >= maxUpdates)
      {
         SPX_MSG_INFO3((*this->spxout), (*this->spxout) << "IBASIS06 update count triggers refactorization"
                       << " updateCount= " << updateCount
                       << " maxUpdates= " << maxUpdates
                       << std::endl;)
         factorize();
      }
      else
      {
         try
         {
#ifdef MEASUREUPDATETIME
            theTime.start();
#endif
            factor->change(i, *enterVec, eta);
            totalUpdateCount++;
#ifdef MEASUREUPDATETIME
            theTime.stop();
#endif
         }
         catch(...)
         {
            SPX_MSG_INFO3((*this->spxout), (*this->spxout) <<
                          "IBASIS13 problems updating factorization; refactorizing basis"
                          << std::endl;)

#ifdef MEASUREUPDATETIME
            theTime.stop();
#endif

            // singularity was detected in update; we refactorize
            factorize();

            // if factorize() detects singularity, an exception is thrown, hence at this point we have a regular basis
            // and can try the update again
            assert(status() >= SPxBasisBase<R>::REGULAR);

            try
            {
#ifdef MEASUREUPDATETIME
               theTime.start();
#endif
               factor->change(i, *enterVec, eta);
               totalUpdateCount++;
#ifdef MEASUREUPDATETIME
               theTime.stop();
#endif
            }
            // with a freshly factorized, regular basis, the update is unlikely to fail; if this happens nevertheless,
            // we have to invalidate the basis to have the statuses correct
            catch(const SPxException& F)
            {
               SPX_MSG_INFO3((*this->spxout), (*this->spxout) <<
                             "IBASIS14 problems updating factorization; invalidating factorization"
                             << std::endl;)

#ifdef MEASUREUPDATETIME
               theTime.stop();
#endif

               factorized = false;
               throw F;
            }
         }

         assert(minStab > 0.0);

         if(factor->status() != SLinSolver<R>::OK || factor->stability() < minStab)
         {
            SPX_MSG_INFO3((*this->spxout), (*this->spxout) << "IBASIS07 stability triggers refactorization"
                          << " stability= " << factor->stability()
                          << " minStab= " << minStab
                          << std::endl;)
            factorize();
         }
      }
   }
   else
      lastout = id;
}